

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O1

void Sbm_AddCardinConstrTest(void)

{
  Vec_Int_t *__ptr;
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  sat_solver *s;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int Lit;
  Vec_Int_t *vVars;
  int local_44;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  p->pArray = piVar2;
  s = Sbm_AddCardinSolver(3,&local_38);
  sat_solver_nvars(s);
  if (local_38->nSize < 3) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  local_40 = local_38;
  if (local_38->pArray[2] < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_44 = local_38->pArray[2] * 2 + 1;
  sat_solver_nclauses(s);
  printf("LogN = %d. N = %3d.   Vars = %5d. Clauses = %6d.  Comb = %d.\n",3,8);
  uVar3 = 1;
  do {
    uVar5 = 0;
    iVar1 = sat_solver_solve(s,&local_44,(lit *)&local_40,0,0,0,0);
    if (iVar1 == 1) {
      p->nSize = 0;
      printf("%3d : ",(ulong)uVar3);
      lVar4 = 0;
      do {
        if (s->size <= lVar4) {
LAB_007a88b6:
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        Vec_IntPush(p,(s->model[lVar4] == 1) + uVar5);
        if (s->size <= lVar4) goto LAB_007a88b6;
        printf("%d",(ulong)(s->model[lVar4] == 1));
        lVar4 = lVar4 + 1;
        uVar5 = uVar5 + 2;
      } while (lVar4 != 8);
      putchar(10);
      iVar1 = sat_solver_addclause(s,p->pArray,p->pArray + 8);
      uVar5 = (uint)(iVar1 != 0);
      uVar3 = uVar3 + 1;
    }
    if ((char)uVar5 == '\0') {
      sat_solver_delete(s);
      __ptr = local_40;
      if (local_40->pArray != (int *)0x0) {
        free(local_40->pArray);
        __ptr->pArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      return;
    }
  } while( true );
}

Assistant:

void Sbm_AddCardinConstrTest()
{
    int LogN = 3, nVars = 1 << LogN, K = 2, Count = 1;
    Vec_Int_t * vVars, * vLits = Vec_IntAlloc( nVars );
    sat_solver * pSat = Sbm_AddCardinSolver( LogN, &vVars );
    int nVarsReal = sat_solver_nvars( pSat );

    int Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    printf( "LogN = %d. N = %3d.   Vars = %5d. Clauses = %6d.  Comb = %d.\n", LogN, nVars, nVarsReal, sat_solver_nclauses(pSat), nVars * (nVars-1)/2 + nVars + 1 );
    while ( 1 )
    {
        int i, status = sat_solver_solve( pSat, &Lit, &Lit+1, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vLits );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vLits, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + nVars );
        if ( status == 0 )
            break;
    }

    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
}